

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O2

int __thiscall CCollision::GetTile(CCollision *this,int x,int y)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = this->m_Width + -1;
  if (x / 0x20 < iVar3) {
    iVar3 = x / 0x20;
  }
  if (x < -0x1f) {
    iVar3 = 0;
  }
  iVar2 = this->m_Height + -1;
  if (y / 0x20 < iVar2) {
    iVar2 = y / 0x20;
  }
  if (y < -0x1f) {
    iVar2 = 0;
  }
  bVar1 = this->m_pTiles[iVar2 * this->m_Width + iVar3].m_Index;
  if (0x80 < bVar1) {
    bVar1 = 0;
  }
  return (int)bVar1;
}

Assistant:

int CCollision::GetTile(int x, int y) const
{
	int Nx = clamp(x/32, 0, m_Width-1);
	int Ny = clamp(y/32, 0, m_Height-1);

	return m_pTiles[Ny*m_Width+Nx].m_Index > 128 ? 0 : m_pTiles[Ny*m_Width+Nx].m_Index;
}